

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

void adjust_slots_reserved_size(int type,key_slots *slots)

{
  RSA **ppRVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  uVar4 = slots->reserved_size;
  if (uVar4 == 0) {
    uVar4 = 0x2000;
  }
  else {
    if (slots->size < uVar4) {
      return;
    }
    auVar5._8_4_ = (int)(uVar4 >> 0x20);
    auVar5._0_8_ = uVar4;
    auVar5._12_4_ = 0x45300000;
    dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) * 0.5;
    uVar3 = (ulong)dVar6;
    uVar4 = uVar4 + ((long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3) + 0x3f &
            0xffffffffffffffc0;
  }
  if (type == 1) {
    ppRVar1 = (RSA **)realloc(daemon_vars.keys.keys,uVar4 * 8);
    daemon_vars.keys.keys = ppRVar1;
  }
  else {
    ppRVar1 = (RSA **)realloc(daemon_vars.keys.ecdsa_keys,uVar4 * 8);
    daemon_vars.keys.ecdsa_keys = (EC_KEY **)ppRVar1;
  }
  if ((ppRVar1 != (RSA **)0x0) &&
     (puVar2 = (uint8_t *)realloc(slots->bita_avail,uVar4 >> 3), puVar2 != (uint8_t *)0x0)) {
    memset(puVar2 + (slots->reserved_size + 7 >> 3),0xff,(uVar4 | 7) - slots->reserved_size >> 3);
    slots->bita_avail = puVar2;
    slots->reserved_size = uVar4;
    return;
  }
  dief("no memory");
}

Assistant:

static void adjust_slots_reserved_size(int type, struct key_slots *slots)
{
#define ROUND2WORD(n) (n + 64 - 1 - (n + 64 - 1) % 64)
    if (!slots->reserved_size || (slots->size >= slots->reserved_size)) {
        size_t size = slots->reserved_size ? ROUND2WORD((size_t)(slots->reserved_size * 0.50) + slots->reserved_size)
                : default_reserved_size;
#undef ROUND2WORD

        switch (type) {
        case NEVERBLEED_TYPE_RSA:
            if ((daemon_vars.keys.keys = realloc(daemon_vars.keys.keys, sizeof(*daemon_vars.keys.keys) * size)) == NULL)
                dief("no memory");
            break;
        case NEVERBLEED_TYPE_ECDSA:
            if ((daemon_vars.keys.ecdsa_keys = realloc(daemon_vars.keys.ecdsa_keys, sizeof(*daemon_vars.keys.ecdsa_keys) * size)) == NULL)
                dief("no memory");
            break;
        default:
            dief("invalid type adjusting reserved");
        }

        uint8_t *b;
        if ((b = realloc(slots->bita_avail, BITBYTES(size))) == NULL)
            dief("no memory");

        /* set all bits to 1 making all slots available */
        memset(&b[BITBYTES(slots->reserved_size)], 0xff, BITBYTES(size - slots->reserved_size));

        slots->bita_avail = b;
        slots->reserved_size = size;
    }
}